

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O1

Pdr_Man_t * Pdr_ManStart(Aig_Man_t *pAig,Pdr_Par_t *pPars,Vec_Int_t *vPrioInit)

{
  int iVar1;
  uint uVar2;
  Pdr_Man_t *pMan;
  Gia_Man_t *pGVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Vec_t *pVVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  Vec_Wec_t *pVVar8;
  Cnf_Man_t *pCVar9;
  Txs3_Man_t *pTVar10;
  uint *puVar11;
  abctime *paVar12;
  void **__s;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  size_t __nmemb;
  long lVar16;
  int iVar17;
  
  pMan = (Pdr_Man_t *)calloc(1,0x1d0);
  pMan->pPars = pPars;
  pMan->pAig = pAig;
  if (((pPars->fFlopPrio == 0) && (pPars->fNewXSim == 0)) && (pPars->fUseAbs == 0)) {
    pGVar3 = (Gia_Man_t *)0x0;
  }
  else {
    pGVar3 = Gia_ManFromAigSimple(pAig);
  }
  pMan->pGia = pGVar3;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 0;
  pVVar4->nSize = 0;
  pVVar4->pArray = (void **)0x0;
  pMan->vSolvers = pVVar4;
  pVVar5 = (Vec_Vec_t *)malloc(0x10);
  pVVar5->nCap = 0;
  pVVar5->nSize = 0;
  pVVar5->pArray = (void **)0x0;
  pMan->vClauses = pVVar5;
  pMan->pQueue = (Pdr_Obl_t *)0x0;
  piVar6 = (int *)malloc((long)pAig->nRegs << 2);
  pMan->pOrder = piVar6;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 0x100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(0x400);
  pVVar7->pArray = piVar6;
  pMan->vActVars = pVVar7;
  if (pMan->pPars->fMonoCnf == 0) {
    iVar1 = Aig_ManLevels(pAig);
    iVar17 = 1;
    if (1 < iVar1) {
      iVar17 = iVar1;
    }
    pVVar8 = (Vec_Wec_t *)malloc(0x10);
    __nmemb = 8;
    if (6 < iVar1) {
      __nmemb = (size_t)(iVar17 + 1U);
    }
    pVVar8->nSize = 0;
    pVVar8->nCap = (int)__nmemb;
    pVVar7 = (Vec_Int_t *)calloc(__nmemb,0x10);
    pVVar8->pArray = pVVar7;
    pVVar8->nSize = iVar17 + 1U;
    pMan->vVLits = pVVar8;
  }
  iVar17 = pAig->nRegs;
  iVar1 = iVar17;
  if (1 < (ulong)(long)iVar17) {
    uVar2 = iVar17 - 1;
    if (uVar2 == 0) {
      iVar1 = 0;
    }
    else {
      uVar15 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      iVar1 = (uVar15 ^ 0xffffffe0) + 0x21;
    }
  }
  pMan->nPrioShift = iVar1;
  if (vPrioInit == (Vec_Int_t *)0x0) {
    if (pPars->fFlopPrio == 0) {
      vPrioInit = (Vec_Int_t *)malloc(0x10);
      iVar1 = 0x10;
      if (0xe < iVar17 - 1U) {
        iVar1 = iVar17;
      }
      vPrioInit->nSize = 0;
      vPrioInit->nCap = iVar1;
      if (iVar1 == 0) {
        piVar6 = (int *)0x0;
      }
      else {
        piVar6 = (int *)malloc((long)iVar1 << 2);
      }
      vPrioInit->pArray = piVar6;
      vPrioInit->nSize = iVar17;
      if (piVar6 != (int *)0x0) {
        memset(piVar6,0,(long)iVar17 << 2);
      }
    }
    else {
      vPrioInit = Pdr_ManDeriveFlopPriorities2(pMan->pGia,1);
    }
  }
  pMan->vPrio = vPrioInit;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vLits = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vCiObjs = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vCoObjs = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vCiVals = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vCoVals = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vNodes = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vUndo = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vVisits = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vCi2Rem = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vRes = pVVar7;
  pTVar10 = (Txs3_Man_t *)0x0;
  pCVar9 = Cnf_ManStart();
  pMan->pCnfMan = pCVar9;
  if (pPars->fNewXSim != 0) {
    pTVar10 = Txs3_ManStart(pMan,pAig,pMan->vPrio);
  }
  pMan->pTxs3 = pTVar10;
  if (pAig->pFanData == (int *)0x0) {
    Aig_ManFanoutStart(pAig);
  }
  if (pAig->pTerSimData == (uint *)0x0) {
    iVar17 = pAig->vObjs->nSize;
    iVar1 = iVar17 + 0xf;
    if (-1 < iVar17) {
      iVar1 = iVar17;
    }
    puVar11 = (uint *)calloc((long)((iVar1 >> 4) + 1),4);
    pAig->pTerSimData = puVar11;
  }
  iVar17 = pPars->nTimeOutOne;
  if ((long)iVar17 != 0) {
    lVar16 = (long)pAig->nTruePos;
    paVar12 = (abctime *)malloc(lVar16 * 8);
    pMan->pTime4Outs = paVar12;
    if (0 < lVar16) {
      lVar14 = 0;
      do {
        paVar12[lVar14] = (long)iVar17 * 1000 + 1;
        lVar14 = lVar14 + 1;
      } while (lVar16 != lVar14);
    }
  }
  if (pPars->fSolveAll != 0) {
    iVar17 = pMan->pAig->nTruePos;
    pVVar4 = (Vec_Ptr_t *)malloc(0x10);
    iVar1 = 8;
    if (6 < iVar17 - 1U) {
      iVar1 = iVar17;
    }
    pVVar4->nSize = 0;
    pVVar4->nCap = iVar1;
    if (iVar1 == 0) {
      __s = (void **)0x0;
    }
    else {
      __s = (void **)malloc((long)iVar1 << 3);
    }
    pVVar4->pArray = __s;
    pVVar4->nSize = iVar17;
    piVar6 = (int *)0x0;
    memset(__s,0,(long)iVar17 << 3);
    pMan->vCexes = pVVar4;
    uVar2 = pAig->nTruePos;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    uVar15 = 0x10;
    if (0xe < uVar2 - 1) {
      uVar15 = uVar2;
    }
    pVVar7->nSize = 0;
    pVVar7->nCap = uVar15;
    if (uVar15 != 0) {
      piVar6 = (int *)malloc((long)(int)uVar15 << 2);
    }
    pVVar7->pArray = piVar6;
    pMan->pPars->vOutMap = pVVar7;
    if ((int)uVar15 < (int)uVar2) {
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc((long)(int)uVar2 << 2);
      }
      else {
        piVar6 = (int *)realloc(piVar6,(long)(int)uVar2 << 2);
      }
      pVVar7->pArray = piVar6;
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar7->nCap = uVar2;
    }
    if (0 < (int)uVar2) {
      piVar6 = pVVar7->pArray;
      uVar13 = 0;
      do {
        piVar6[uVar13] = -2;
        uVar13 = uVar13 + 1;
      } while (uVar2 != uVar13);
    }
    pVVar7->nSize = uVar2;
  }
  return pMan;
}

Assistant:

Pdr_Man_t * Pdr_ManStart( Aig_Man_t * pAig, Pdr_Par_t * pPars, Vec_Int_t * vPrioInit )
{
    Pdr_Man_t * p;
    p = ABC_CALLOC( Pdr_Man_t, 1 );
    p->pPars    = pPars;
    p->pAig     = pAig;
    p->pGia     = (pPars->fFlopPrio || p->pPars->fNewXSim || p->pPars->fUseAbs) ? Gia_ManFromAigSimple(pAig) : NULL;
    p->vSolvers = Vec_PtrAlloc( 0 );
    p->vClauses = Vec_VecAlloc( 0 );
    p->pQueue   = NULL;
    p->pOrder   = ABC_ALLOC( int, Aig_ManRegNum(pAig) );
    p->vActVars = Vec_IntAlloc( 256 );
    if ( !p->pPars->fMonoCnf )
        p->vVLits   = Vec_WecStart( 1+Abc_MaxInt(1, Aig_ManLevels(pAig)) );
    // internal use
    p->nPrioShift = Abc_Base2Log(Aig_ManRegNum(pAig));
    if ( vPrioInit )
        p->vPrio = vPrioInit;
    else if ( pPars->fFlopPrio )
        p->vPrio = Pdr_ManDeriveFlopPriorities2(p->pGia, 1);
//    else if ( p->pPars->fNewXSim )
//        p->vPrio = Vec_IntStartNatural( Aig_ManRegNum(pAig) );
    else 
        p->vPrio = Vec_IntStart( Aig_ManRegNum(pAig) );
    p->vLits    = Vec_IntAlloc( 100 );  // array of literals
    p->vCiObjs  = Vec_IntAlloc( 100 );  // cone leaves
    p->vCoObjs  = Vec_IntAlloc( 100 );  // cone roots
    p->vCiVals  = Vec_IntAlloc( 100 );  // cone leaf values
    p->vCoVals  = Vec_IntAlloc( 100 );  // cone root values
    p->vNodes   = Vec_IntAlloc( 100 );  // cone nodes
    p->vUndo    = Vec_IntAlloc( 100 );  // cone undos
    p->vVisits  = Vec_IntAlloc( 100 );  // intermediate
    p->vCi2Rem  = Vec_IntAlloc( 100 );  // CIs to be removed
    p->vRes     = Vec_IntAlloc( 100 );  // final result
    p->pCnfMan  = Cnf_ManStart();
    // ternary simulation
    p->pTxs3    = pPars->fNewXSim ? Txs3_ManStart( p, pAig, p->vPrio ) : NULL;
    // additional AIG data-members
    if ( pAig->pFanData == NULL )
        Aig_ManFanoutStart( pAig );
    if ( pAig->pTerSimData == NULL )
        pAig->pTerSimData = ABC_CALLOC( unsigned, 1 + (Aig_ManObjNumMax(pAig) / 16) );
    // time spent on each outputs
    if ( pPars->nTimeOutOne )
    {
        int i;
        p->pTime4Outs = ABC_ALLOC( abctime, Saig_ManPoNum(pAig) );
        for ( i = 0; i < Saig_ManPoNum(pAig); i++ )
            p->pTime4Outs[i] = pPars->nTimeOutOne * CLOCKS_PER_SEC / 1000 + 1;
    }
    if ( pPars->fSolveAll )
    {
        p->vCexes = Vec_PtrStart( Saig_ManPoNum(p->pAig) );
        p->pPars->vOutMap = Vec_IntAlloc( Saig_ManPoNum(pAig) );
        Vec_IntFill( p->pPars->vOutMap, Saig_ManPoNum(pAig), -2 );
    }
    return p;
}